

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckStructure.h
# Opt level: O0

void __thiscall CheckStructure::CheckStructure(CheckStructure *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string *local_2c0;
  string *local_218;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  undefined1 local_1a7;
  allocator local_1a6;
  allocator local_1a5;
  allocator local_1a4;
  allocator local_1a3;
  allocator local_1a2;
  allocator local_1a1;
  string *local_1a0;
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  iterator local_d8;
  size_type local_d0;
  allocator local_c3;
  allocator local_c2;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c1;
  undefined1 local_c0;
  allocator local_bf;
  allocator local_be;
  allocator local_bd [20];
  allocator local_a9;
  string *local_a8;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type local_18;
  CheckStructure *local_10;
  CheckStructure *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)this);
  this->m_coutTypes = 0;
  this->m_countCalls = 0;
  this->m_fWrongType = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_errors);
  local_c0 = 1;
  local_a8 = local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"double",&local_a9);
  local_a8 = local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"int",local_bd);
  local_a8 = local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"void",&local_be);
  local_a8 = local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"string",&local_bf);
  local_c0 = 0;
  local_20 = (iterator)local_a0;
  local_18 = 4;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_c1);
  __l_00._M_len = local_18;
  __l_00._M_array = local_20;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->types,__l_00,&local_c1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_c1);
  local_218 = (string *)&local_20;
  do {
    local_218 = local_218 + -0x20;
    std::__cxx11::string::~string(local_218);
  } while (local_218 != local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bf);
  std::allocator<char>::~allocator((allocator<char> *)&local_be);
  std::allocator<char>::~allocator((allocator<char> *)local_bd);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->nMain,"main",&local_c2);
  std::allocator<char>::~allocator((allocator<char> *)&local_c2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->nReturn,"return",&local_c3);
  std::allocator<char>::~allocator((allocator<char> *)&local_c3);
  local_1a7 = 1;
  local_1a0 = local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"(",&local_1a1);
  local_1a0 = local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,")",&local_1a2);
  local_1a0 = local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"{",&local_1a3);
  local_1a0 = local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_138,";",&local_1a4);
  local_1a0 = local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"}",&local_1a5);
  local_1a0 = local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"()",&local_1a6);
  local_1a7 = 0;
  local_d8 = (iterator)local_198;
  local_d0 = 6;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1a8);
  __l._M_len = local_d0;
  __l._M_array = local_d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->delimiters,__l,&local_1a8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1a8);
  local_2c0 = (string *)&local_d8;
  do {
    local_2c0 = local_2c0 + -0x20;
    std::__cxx11::string::~string(local_2c0);
  } while (local_2c0 != local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a6);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a5);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a4);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a3);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a2);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  return;
}

Assistant:

CheckStructure() : m_coutTypes(0), m_countCalls(0){}